

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_optLdm_processMatchCandidate
               (ZSTD_optLdm_t *optLdm,ZSTD_match_t *matches,U32 *nbMatches,U32 currPosInBlock,
               U32 remainingBytes)

{
  uint in_ECX;
  U32 *in_RDX;
  ZSTD_match_t *in_RSI;
  rawSeqStore_t *in_RDI;
  undefined4 in_R8D;
  U32 posOvershoot;
  ZSTD_optLdm_t *unaff_retaddr;
  uint in_stack_ffffffffffffffdc;
  
  if ((in_RDI->size != 0) && (in_RDI->pos < in_RDI->size)) {
    if (*(uint *)((long)&in_RDI[1].seq + 4) <= in_ECX) {
      if (*(uint *)((long)&in_RDI[1].seq + 4) < in_ECX) {
        in_stack_ffffffffffffffdc = in_ECX - *(int *)((long)&in_RDI[1].seq + 4);
        ZSTD_optLdm_skipRawSeqStoreBytes(in_RDI,(ulong)in_stack_ffffffffffffffdc);
      }
      ZSTD_opt_getNextMatchAndUpdateSeqStore(unaff_retaddr,(U32)((ulong)in_RDI >> 0x20),(U32)in_RDI)
      ;
    }
    ZSTD_optLdm_maybeAddMatch
              (in_RSI,in_RDX,(ZSTD_optLdm_t *)CONCAT44(in_ECX,in_R8D),in_stack_ffffffffffffffdc);
  }
  return;
}

Assistant:

static void
ZSTD_optLdm_processMatchCandidate(ZSTD_optLdm_t* optLdm,
                                  ZSTD_match_t* matches, U32* nbMatches,
                                  U32 currPosInBlock, U32 remainingBytes)
{
    if (optLdm->seqStore.size == 0 || optLdm->seqStore.pos >= optLdm->seqStore.size) {
        return;
    }

    if (currPosInBlock >= optLdm->endPosInBlock) {
        if (currPosInBlock > optLdm->endPosInBlock) {
            /* The position at which ZSTD_optLdm_processMatchCandidate() is called is not necessarily
             * at the end of a match from the ldm seq store, and will often be some bytes
             * over beyond matchEndPosInBlock. As such, we need to correct for these "overshoots"
             */
            U32 const posOvershoot = currPosInBlock - optLdm->endPosInBlock;
            ZSTD_optLdm_skipRawSeqStoreBytes(&optLdm->seqStore, posOvershoot);
        }
        ZSTD_opt_getNextMatchAndUpdateSeqStore(optLdm, currPosInBlock, remainingBytes);
    }
    ZSTD_optLdm_maybeAddMatch(matches, nbMatches, optLdm, currPosInBlock);
}